

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wind(OutputFile *this,uint32_t ind)

{
  ostream *poVar1;
  uint32_t ind_00;
  string local_38;
  uint local_14;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *this_local;
  
  local_14 = ind;
  pOStack_10 = this;
  poVar1 = stream(this);
  indent_abi_cxx11_(&local_38,(re2c *)(ulong)local_14,ind_00);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

OutputFile & OutputFile::wind (uint32_t ind)
{
	stream () << indent(ind);
	return *this;
}